

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool __thiscall
llvm::cl::parser<unsigned_int>::parse
          (parser<unsigned_int> *this,Option *O,StringRef ArgName,StringRef Arg,uint *Value)

{
  type_conflict1 tVar1;
  raw_ostream *Errs;
  StringRef local_80;
  Twine local_70;
  Twine local_58;
  Twine local_40;
  
  local_80.Length = Arg.Length;
  local_80.Data = Arg.Data;
  tVar1 = StringRef::getAsInteger<unsigned_int>(&local_80,0,Value);
  if (tVar1) {
    Twine::Twine(&local_58,"\'",&local_80);
    Twine::Twine(&local_70,"\' value invalid for uint argument!");
    Twine::concat(&local_40,&local_58,&local_70);
    Errs = errs();
    Option::error(O,&local_40,(StringRef)ZEXT816(0),Errs);
  }
  return tVar1;
}

Assistant:

bool parser<unsigned>::parse(Option &O, StringRef ArgName, StringRef Arg,
                             unsigned &Value) {

  if (Arg.getAsInteger(0, Value))
    return O.error("'" + Arg + "' value invalid for uint argument!");
  return false;
}